

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::Vertex::Le(Vertex *this,
                vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *infiniteLights,
                Vertex *v,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  pointer pLVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  float fVar6;
  ushort uVar7;
  uint *puVar8;
  ImageInfiniteLight *this_00;
  LightHandle *light;
  pointer pLVar9;
  DiffuseAreaLight *this_01;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar20 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  SampledSpectrum SVar31;
  Point3f p;
  Vector3f w;
  Ray local_58;
  undefined1 auVar16 [64];
  undefined1 auVar23 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [56];
  
  auVar10 = ZEXT816(0) << 0x40;
  if ((this->type == Light) ||
     ((this->type == Surface &&
      (((this->field_2).si.areaLight.
        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
        .bits & 0xffffffffffff) != 0)))) {
    uVar1 = *(undefined8 *)
             &(v->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    auVar12 = vinsertps_avx(*(undefined1 (*) [16])&v->field_2,
                            ZEXT416((uint)(v->field_2).ei.super_Interaction.pi.
                                          super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
    uVar2 = *(undefined8 *)
             &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    auVar5 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                           ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                         super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
    auVar11._0_4_ = ((float)uVar1 + auVar12._0_4_) * 0.5;
    auVar11._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar12._4_4_) * 0.5;
    auVar11._8_4_ = (auVar12._8_4_ + 0.0) * 0.5;
    auVar11._12_4_ = (auVar12._12_4_ + 0.0) * 0.5;
    auVar28._0_4_ = ((float)uVar2 + auVar5._0_4_) * 0.5;
    auVar28._4_4_ = ((float)((ulong)uVar2 >> 0x20) + auVar5._4_4_) * 0.5;
    auVar28._8_4_ = (auVar5._8_4_ + 0.0) * 0.5;
    auVar28._12_4_ = (auVar5._12_4_ + 0.0) * 0.5;
    auVar5 = vsubps_avx(auVar11,auVar28);
    auVar12._0_4_ = auVar5._0_4_ * auVar5._0_4_;
    auVar12._4_4_ = auVar5._4_4_ * auVar5._4_4_;
    auVar12._8_4_ = auVar5._8_4_ * auVar5._8_4_;
    auVar12._12_4_ = auVar5._12_4_ * auVar5._12_4_;
    auVar12 = vhaddps_avx(auVar12,auVar12);
    fVar6 = ((v->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
            (v->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 -
            ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
            (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    fVar30 = auVar12._0_4_ + fVar6 * fVar6;
    if ((fVar30 != 0.0) || (NAN(fVar30))) {
      if (fVar30 < 0.0) {
        fVar30 = sqrtf(fVar30);
        auVar10 = ZEXT816(0) << 0x40;
      }
      else {
        auVar12 = vsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
        fVar30 = auVar12._0_4_;
      }
      auVar21._4_4_ = fVar30;
      auVar21._0_4_ = fVar30;
      auVar21._8_4_ = fVar30;
      auVar21._12_4_ = fVar30;
      auVar12 = vdivps_avx(auVar5,auVar21);
      w.super_Tuple3<pbrt::Vector3,_float>.z = fVar6 / fVar30;
      w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar12._0_8_;
      if ((this->type == Light) &&
         ((puVar8 = (uint *)((ulong)(this->field_2).ei.field_0 & 0xffffffffffff),
          puVar8 == (uint *)0x0 || ((*puVar8 & 0xfffffffd) == 1)))) {
        pLVar9 = (infiniteLights->
                 super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pLVar3 = (infiniteLights->
                 super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pLVar9 != pLVar3) {
          auVar29._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
          auVar29._8_4_ = auVar12._8_4_ ^ 0x80000000;
          auVar29._12_4_ = auVar12._12_4_ ^ 0x80000000;
          fVar30 = -w.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar12 = auVar10;
          do {
            uVar1 = *(undefined8 *)
                     &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
            auVar10 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                                    ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                                  super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high)
                                    ,0x10);
            auVar13._0_4_ = ((float)uVar1 + auVar10._0_4_) * 0.5;
            auVar13._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar10._4_4_) * 0.5;
            auVar13._8_4_ = (auVar10._8_4_ + 0.0) * 0.5;
            auVar13._12_4_ = (auVar10._12_4_ + 0.0) * 0.5;
            local_58.o.super_Tuple3<pbrt::Point3,_float>.z =
                 ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                 (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
            local_58.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar13);
            local_58.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar29);
            local_58.time = 0.0;
            local_58.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                     )0;
            uVar4 = (pLVar9->
                    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                    ).bits;
            auVar10 = ZEXT416(0) << 0x20;
            auVar20 = ZEXT456(0);
            auVar22._0_12_ = ZEXT812(0);
            auVar22._12_4_ = 0;
            auVar27 = ZEXT456(0);
            uVar7 = (ushort)(uVar4 >> 0x30);
            if (6 < uVar7) {
              this_00 = (ImageInfiniteLight *)(uVar4 & 0xffffffffffff);
              local_58.d.super_Tuple3<pbrt::Vector3,_float>.z = fVar30;
              if (uVar4 >> 0x30 == 8) {
                SVar31 = ImageInfiniteLight::Le(this_00,&local_58,lambda);
                auVar24._0_8_ = SVar31.values.values._8_8_;
                auVar24._8_56_ = auVar27;
                auVar22 = auVar24._0_16_;
                auVar17._0_8_ = SVar31.values.values._0_8_;
                auVar17._8_56_ = auVar20;
                auVar10 = auVar17._0_16_;
              }
              else if (uVar7 == 7) {
                SVar31 = UniformInfiniteLight::Le((UniformInfiniteLight *)this_00,&local_58,lambda);
                auVar23._0_8_ = SVar31.values.values._8_8_;
                auVar23._8_56_ = auVar27;
                auVar22 = auVar23._0_16_;
                auVar16._0_8_ = SVar31.values.values._0_8_;
                auVar16._8_56_ = auVar20;
                auVar10 = auVar16._0_16_;
              }
              else {
                SVar31 = PortalImageInfiniteLight::Le
                                   ((PortalImageInfiniteLight *)this_00,&local_58,lambda);
                auVar25._0_8_ = SVar31.values.values._8_8_;
                auVar25._8_56_ = auVar27;
                auVar22 = auVar25._0_16_;
                auVar18._0_8_ = SVar31.values.values._0_8_;
                auVar18._8_56_ = auVar20;
                auVar10 = auVar18._0_16_;
              }
            }
            auVar5 = vmovlhps_avx(auVar10,auVar22);
            auVar10._0_4_ = auVar5._0_4_ + auVar12._0_4_;
            auVar10._4_4_ = auVar5._4_4_ + auVar12._4_4_;
            auVar10._8_4_ = auVar5._8_4_ + auVar12._8_4_;
            auVar10._12_4_ = auVar5._12_4_ + auVar12._12_4_;
            pLVar9 = pLVar9 + 1;
            auVar12 = auVar10;
          } while (pLVar9 != pLVar3);
        }
      }
      else {
        uVar4 = (this->field_2).si.areaLight.
                super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                .bits;
        this_01 = (DiffuseAreaLight *)(uVar4 & 0xffffffffffff);
        if (this_01 != (DiffuseAreaLight *)0x0) {
          uVar1 = *(undefined8 *)
                   &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
          auVar10 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                                  ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                                super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                                  0x10);
          auVar14._0_4_ = (float)uVar1 + auVar10._0_4_;
          auVar14._4_4_ = (float)((ulong)uVar1 >> 0x20) + auVar10._4_4_;
          auVar14._8_4_ = auVar10._8_4_ + 0.0;
          auVar14._12_4_ = auVar10._12_4_ + 0.0;
          auVar5._8_4_ = 0x3f000000;
          auVar5._0_8_ = 0x3f0000003f000000;
          auVar5._12_4_ = 0x3f000000;
          auVar10 = vmulps_avx512vl(auVar14,auVar5);
          if ((this_01->super_LightBase).type != Area) {
            LogFatal<char_const(&)[26]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.h"
                       ,0x2f4,"Check failed: %s",(char (*) [26])"Type() == LightType::Area");
          }
          auVar15._12_4_ = 0;
          auVar15._0_12_ = ZEXT812(0);
          auVar15 = auVar15 << 0x20;
          auVar12 = ZEXT816(0) << 0x20;
          if ((short)(uVar4 >> 0x30) == 6) {
            p.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar10._0_8_;
            p.super_Tuple3<pbrt::Point3,_float>.z =
                 ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                 (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
            auVar27 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
            auVar20 = ZEXT856(auVar10._8_8_);
            SVar31 = DiffuseAreaLight::L(this_01,p,
                                         (Normal3f)
                                         *(Tuple3<pbrt::Normal3,_float> *)
                                          ((long)&this->field_2 + 0x28),
                                         (Point2f)(this->field_2).ei.super_Interaction.uv.
                                                  super_Tuple2<pbrt::Point2,_float>,w,lambda);
            auVar26._0_8_ = SVar31.values.values._8_8_;
            auVar26._8_56_ = auVar27;
            auVar12 = auVar26._0_16_;
            auVar19._0_8_ = SVar31.values.values._0_8_;
            auVar19._8_56_ = auVar20;
            auVar15 = auVar19._0_16_;
          }
          auVar10 = vmovlhps_avx(auVar15,auVar12);
        }
      }
    }
  }
  auVar12 = vshufpd_avx(auVar10,auVar10,1);
  SVar31.values.values._0_8_ = auVar10._0_8_;
  SVar31.values.values._8_8_ = auVar12._0_8_;
  return (SampledSpectrum)SVar31.values.values;
}

Assistant:

SampledSpectrum Le(const std::vector<LightHandle> &infiniteLights, const Vertex &v,
                       const SampledWavelengths &lambda) const {
        if (!IsLight())
            return SampledSpectrum(0.f);
        Vector3f w = v.p() - p();
        if (LengthSquared(w) == 0)
            return SampledSpectrum(0.);
        w = Normalize(w);
        if (IsInfiniteLight()) {
            // Return emitted radiance for infinite light sources
            SampledSpectrum Le(0.f);
            for (const auto &light : infiniteLights)
                Le += light.Le(Ray(p(), -w), lambda);
            return Le;

        } else if (si.areaLight)
            return si.areaLight.L(si.p(), si.n, si.uv, w, lambda);
        else
            return SampledSpectrum(0.f);
    }